

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O1

void __thiscall
Js::ProbeContainer::DispatchProbeHandlers(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  ProbeList *pPVar1;
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  Probe *pPVar2;
  ProbeContainer *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ProbeContainer *local_50;
  FinallyObject local_48;
  ProbeContainer *local_38;
  
  bVar4 = CanDispatchHalt(this,pHaltState);
  if (bVar4) {
    local_48.finallyFunc = (anon_class_48_6_9e8417c9 *)&local_50;
    local_48.abnormalTermination = true;
    local_50 = this;
    local_38 = this;
    InitializeLocation(this,pHaltState,true);
    bVar4 = InterpreterHaltState::IsValid(pHaltState);
    if (bVar4) {
      pPVar1 = local_38->diagProbeList;
      this_00 = local_38->pendingProbeList;
      if (0 < (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count) {
        lVar7 = 0;
        do {
          pPVar2 = (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>
                   ).buffer[lVar7];
          iVar5 = (**(pPVar2->super_HaltCallback)._vptr_HaltCallback)(pPVar2);
          if ((char)iVar5 != '\0') {
            JsUtil::
            List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_00,0);
            iVar5 = (this_00->
                    super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
            (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer[iVar5] = pPVar2;
            (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count = iVar5 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pPVar1->
                         super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                         count);
      }
      pPVar3 = local_38;
      if (0 < (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count) {
        iVar5 = 0;
        do {
          if (pPVar3->haltCallbackProbe != (HaltCallback *)0x0) {
            iVar6 = (*pPVar3->haltCallbackProbe->_vptr_HaltCallback[3])();
            if ((char)iVar6 == '\0') {
              StepController::Deactivate(&pPVar3->debugManager->stepController,pHaltState);
              AsyncBreakController::Deactivate(&pPVar3->debugManager->asyncBreakController);
              (*pPVar3->haltCallbackProbe->_vptr_HaltCallback[1])
                        (pPVar3->haltCallbackProbe,pHaltState);
            }
          }
        } while ((pPVar3->IsNextStatementChanged == false) &&
                (iVar5 = iVar5 + 1,
                iVar5 < (this_00->
                        super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                        count));
      }
    }
    local_48.abnormalTermination = false;
    anon_func::FinallyObject::~FinallyObject(&local_48);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchProbeHandlers(InterpreterHaltState* pHaltState)
    {
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);

            if (pHaltState->IsValid())
            {
                Js::ProbeList * localPendingProbeList = this->pendingProbeList;
                diagProbeList->Map([pHaltState, localPendingProbeList](int index, Probe * probe)
                {
                    if (probe->CanHalt(pHaltState))
                    {
                        localPendingProbeList->Add(probe);
                    }
                });

                if (localPendingProbeList->Count() != 0)
                {
                    localPendingProbeList->MapUntil([&](int index, Probe * probe)
                    {
                        if (haltCallbackProbe && !haltCallbackProbe->IsInClosedState())
                        {
                            debugManager->stepController.Deactivate(pHaltState);
                            debugManager->asyncBreakController.Deactivate();
                            haltCallbackProbe->DispatchHalt(pHaltState);
                        }
                        // If SetNextStatement happened between multiple BPs on same location, IP changed so rest of dispatch are not valid.
                        return this->IsSetNextStatementCalled();
                    });
                }
            }
        },
        [&](bool)
        {
            pendingProbeList->Clear();
            DestroyLocation();
        });
    }